

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O2

int as154_seas(double *inp,int N,int optmethod,int p,int d,int q,int s,int P,int D,int Q,double *phi
              ,double *theta,double *PHI,double *THETA,double *wmean,double *var,double *loglik,
              double *hess,int cssml)

{
  size_t __size;
  void *__ptr;
  double *__ptr_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  double *pdVar5;
  reg_object obj;
  alik_seas_object paVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  double dVar17;
  undefined1 local_f0 [8];
  custom_function as154_min;
  double local_d0;
  int local_b4;
  int local_b0;
  int p_local;
  int q_local;
  int *local_a0;
  double *local_98;
  ulong local_90;
  double *local_88;
  double *local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  alik_seas_object local_58;
  int local_50;
  uint local_4c;
  ulong local_48;
  ulong local_40;
  uint local_34;
  
  iVar1 = P;
  uVar15 = (ulong)(uint)q;
  local_48 = (ulong)(uint)Q;
  uVar16 = (ulong)(uint)P;
  p_local = D * s;
  local_b4 = p;
  local_b0 = q;
  local_50 = d;
  local_34 = optmethod;
  pdVar4 = (double *)malloc((long)(N - p_local) << 3);
  iVar3 = local_50;
  iVar11 = (int)local_48;
  local_68 = uVar15;
  local_60 = uVar16;
  if (cssml == 1) {
    local_4c = N;
    css_seas(inp,N,local_34,p,local_50,q,s,iVar1,D,iVar11,phi,theta,PHI,THETA,wmean,var,loglik,hess)
    ;
    iVar1 = checkroots_cerr(phi,&local_b4,theta,&local_b0,PHI,&P,THETA,&Q);
    if (iVar1 == 10) {
      return 10;
    }
    if (iVar1 == 0xc) {
      return 0xc;
    }
    local_d0 = *wmean;
    N = local_4c;
  }
  else {
    uVar13 = 0;
    uVar12 = 0;
    if (0 < p) {
      uVar12 = (ulong)(uint)p;
    }
    for (; uVar12 != uVar13; uVar13 = uVar13 + 1) {
      phi[uVar13] = 0.0;
    }
    uVar12 = 0;
    uVar13 = 0;
    if (0 < q) {
      uVar13 = uVar15;
    }
    for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
      theta[uVar12] = 0.0;
    }
    uVar13 = 0;
    uVar15 = 0;
    if (0 < iVar1) {
      uVar15 = uVar16;
    }
    for (; uVar15 != uVar13; uVar13 = uVar13 + 1) {
      PHI[uVar13] = 0.0;
    }
    uVar15 = 0;
    uVar16 = 0;
    if (0 < iVar11) {
      uVar16 = local_48 & 0xffffffff;
    }
    for (; uVar16 != uVar15; uVar15 = uVar15 + 1) {
      THETA[uVar15] = 0.0;
    }
    local_d0 = 0.0;
  }
  iVar1 = D;
  local_70 = (ulong)(uint)p;
  if (D < 1) {
    uVar15 = 0;
    uVar16 = 0;
    if (0 < N) {
      uVar16 = (ulong)(uint)N;
    }
    iVar8 = (int)local_60;
    for (; uVar2 = N, uVar16 != uVar15; uVar15 = uVar15 + 1) {
      pdVar4[uVar15] = inp[uVar15];
    }
  }
  else {
    uVar2 = diffs(inp,N,D,s,pdVar4);
    iVar8 = (int)local_60;
  }
  uVar15 = (ulong)uVar2;
  uVar10 = (int)local_68 + (int)local_70;
  local_90 = (ulong)uVar10;
  iVar8 = iVar8 + uVar10;
  if (((iVar1 == 0 && iVar3 == 0) && -iVar11 == iVar8) && cssml == 1) {
    free(pdVar4);
    local_34 = 1;
  }
  else {
    local_98 = (double *)malloc((long)(int)(uVar2 - iVar3) << 3);
    local_4c = N;
    if (iVar3 < 1) {
      uVar13 = 0;
      uVar16 = 0;
      if (0 < (int)uVar2) {
        uVar16 = uVar15;
      }
      for (; uVar16 != uVar13; uVar13 = uVar13 + 1) {
        local_98[uVar13] = pdVar4[uVar13];
      }
    }
    else {
      uVar2 = diff(pdVar4,uVar2,iVar3,local_98);
      uVar15 = (ulong)uVar2;
    }
    as154_min.params = pdVar4;
    local_78 = uVar15;
    if (D + iVar3 == 0) {
      pdVar4 = (double *)malloc(8);
      iVar1 = (int)local_78;
      pdVar5 = (double *)malloc((long)(int)local_78 * 8);
      obj = reg_init(iVar1,1);
      setIntercept(obj,1);
      regress(obj,(double *)0x0,local_98,pdVar5,pdVar4,0.95);
      uVar15 = local_78;
      local_d0 = obj->beta[0].value;
      free(pdVar4);
      free(pdVar5);
      free_reg(obj);
    }
    uVar16 = local_70;
    lVar14 = (long)(int)uVar15;
    iVar11 = (int)local_70;
    paVar6 = alik_seas_init(iVar11,iVar3,(int)local_68,s,(int)local_60,D,(int)local_48,(int)uVar15);
    uVar15 = (ulong)paVar6->pq;
    __size = uVar15 * 8;
    pdVar4 = (double *)malloc(__size);
    local_80 = (double *)malloc(__size);
    local_88 = (double *)malloc(__size * uVar15);
    _q_local = (double *)malloc(__size);
    local_40 = uVar15;
    local_a0 = (int *)malloc(uVar15 << 2);
    iVar3 = (int)local_78;
    paVar6->N = iVar3;
    iVar1 = paVar6->offset;
    uVar15 = 0;
    uVar13 = 0;
    if (0 < iVar11) {
      uVar13 = uVar16 & 0xffffffff;
    }
    for (; uVar13 != uVar15; uVar15 = uVar15 + 1) {
      pdVar4[uVar15] = phi[uVar15];
    }
    uVar15 = 0;
    uVar16 = 0;
    if (0 < (int)local_68) {
      uVar16 = local_68 & 0xffffffff;
    }
    for (; uVar16 != uVar15; uVar15 = uVar15 + 1) {
      pdVar4[(long)iVar11 + uVar15] = -theta[uVar15];
    }
    local_70 = (ulong)(int)local_90;
    uVar15 = 0;
    uVar12 = 0;
    if (0 < (int)local_60) {
      uVar12 = local_60 & 0xffffffff;
    }
    for (; uVar12 != uVar15; uVar15 = uVar15 + 1) {
      pdVar4[local_70 + uVar15] = PHI[uVar15];
    }
    local_90 = (ulong)iVar8;
    uVar15 = 0;
    uVar7 = 0;
    if (0 < (int)local_48) {
      uVar7 = local_48 & 0xffffffff;
    }
    for (; uVar7 != uVar15; uVar15 = uVar15 + 1) {
      pdVar4[local_90 + uVar15] = -THETA[uVar15];
    }
    if (paVar6->M == 1) {
      pdVar4[(int)local_48 + iVar8] = local_d0;
    }
    paVar6->mean = local_d0;
    uVar15 = 0;
    uVar9 = 0;
    if (0 < iVar3) {
      uVar9 = local_78 & 0xffffffff;
    }
    for (; uVar9 != uVar15; uVar15 = uVar15 + 1) {
      dVar17 = local_98[uVar15];
      paVar6->x[(long)(iVar1 + iVar3 * 2) + uVar15] = dVar17;
      paVar6->x[(long)iVar1 + uVar15] = dVar17;
    }
    for (; lVar14 < iVar3 * 2; lVar14 = lVar14 + 1) {
      paVar6->x[iVar1 + lVar14] = 0.0;
    }
    local_f0 = (undefined1  [8])fas154_seas;
    as154_min.funcpt = (_func_double_double_ptr_int_void_ptr *)paVar6;
    local_58 = paVar6;
    local_34 = fminunc((custom_function *)local_f0,(custom_gradient *)0x0,(int)local_40,pdVar4,1.0,
                       local_34,local_80);
    if ((0xf < local_34) || ((0x8011U >> (local_34 & 0x1f) & 1) == 0)) {
      local_34 = 1;
    }
    uVar15 = 0;
    uVar9 = 0;
    if (0 < (int)local_40) {
      uVar9 = local_40 & 0xffffffff;
    }
    for (; uVar9 != uVar15; uVar15 = uVar15 + 1) {
      _q_local[uVar15] = 1.0;
    }
    pdVar5 = local_80 + iVar11;
    if (0 < (int)local_68) {
      invertroot((int)local_68,pdVar5);
    }
    if (0 < (int)local_48) {
      invertroot((int)local_48,pdVar5 + (long)(int)local_68 + (long)(int)local_60);
    }
    hessian_fd((custom_function *)local_f0,local_80,(int)local_40,_q_local,local_58->eps,hess);
    mtranspose(hess,(int)local_40,(int)local_40,local_88);
    iVar1 = (int)local_40;
    for (uVar15 = 0; (uint)(iVar1 * iVar1) != uVar15; uVar15 = uVar15 + 1) {
      local_88[uVar15] =
           (hess[uVar15] + local_88[uVar15]) * (double)(int)(local_4c - (p_local + local_50)) * 0.5;
    }
    ludecomp(local_88,iVar1,local_a0);
    minverse(local_88,(int)local_40,local_a0,hess);
    paVar6 = local_58;
    __ptr_00 = local_80;
    __ptr = as154_min.params;
    for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
      phi[uVar15] = local_80[uVar15];
    }
    for (uVar15 = 0; uVar16 != uVar15; uVar15 = uVar15 + 1) {
      theta[uVar15] = -pdVar5[uVar15];
    }
    for (uVar15 = 0; uVar12 != uVar15; uVar15 = uVar15 + 1) {
      PHI[uVar15] = local_80[local_70 + uVar15];
    }
    for (uVar15 = 0; uVar7 != uVar15; uVar15 = uVar15 + 1) {
      THETA[uVar15] = -local_80[local_90 + uVar15];
    }
    dVar17 = 0.0;
    if (local_58->M == 1) {
      dVar17 = local_80[iVar8 + (int)local_48];
    }
    *wmean = dVar17;
    *var = local_58->ssq / (double)(int)local_78;
    *loglik = local_58->loglik;
    free(pdVar4);
    free(__ptr_00);
    free(__ptr);
    free(local_98);
    free(_q_local);
    free(local_88);
    free(local_a0);
    free(paVar6);
  }
  return local_34;
}

Assistant:

int as154_seas(double *inp, int N, int optmethod, int p, int d, int q, int s, int P, int D, int Q,double *phi, double *theta, 
	double *PHI, double *THETA, double *wmean,double *var,double *loglik,double *hess,int cssml) {
	int i, pq, retval, length, offset,ret,nd,rp,ERR;
	double *b, *tf, *x,*inp2,*dx,*thess,*res,*varcovar;
	int *ipiv;
	double maxstep,coeff,sigma;
	alik_seas_object obj;
	reg_object fit;
	//custom_function as154_min;
	
	inp2 = (double*)malloc(sizeof(double)* (N - s*D));
	

	length = N;

	maxstep = 1.0;
	coeff = 0.0;
	sigma = 1.0;

	if (cssml == 1) {
		css_seas(inp, N, optmethod, p, d, q, s, P, D, Q, phi, theta, PHI, THETA, wmean, var, loglik, hess);

		ERR = checkroots_cerr(phi, &p, theta, &q, PHI, &P, THETA, &Q);
		if (ERR == 10 || ERR == 12) return ERR;

		coeff = *wmean;
	}
	else {
		for (i = 0; i < p; ++i) phi[i] = 0.0;
		for (i = 0; i < q; ++i) theta[i] = 0.0;
		for (i = 0; i < P; ++i) PHI[i] = 0.0;
		for (i = 0; i < Q; ++i) THETA[i] = 0.0;
	}


	/*

	*/

	nd = d + D;

	if (D > 0) {
		N = diffs(inp, N, D, s, inp2);
	}
	else {
		for (i = 0; i < N; ++i) {
			inp2[i] = inp[i];
		}
	}

	if (p + q + P + Q == 0 && d == 0 && D == 0 && cssml == 1) {
		free(inp2);
		return 1;
	}

	x = (double*)malloc(sizeof(double)* (N - d));

	if (d > 0) {
		N = diff(inp2, N, d, x); // No need to demean x
	}
	else {
		for (i = 0; i < N; ++i) {
			x[i] = inp2[i];
		}
	}

	if (nd == 0) {
		rp = 1;
		varcovar = (double*)malloc(sizeof(double) * rp * rp);
		res = (double*)malloc(sizeof(double) * N);

		fit = reg_init(N, rp);

		setIntercept(fit, 1);
		regress(fit, NULL, x, res, varcovar, 0.95);

		
		coeff = (fit->beta + 0)->value;
		sigma = 10.0 * (fit->beta + 0)->stdErr;


		free(varcovar);
		free(res);
		free_reg(fit);
	}

	obj = alik_seas_init(p, d, q, s, P, D, Q, N);
	pq = obj->pq;
	b = (double*)malloc(sizeof(double)* pq);
	tf = (double*)malloc(sizeof(double)* pq);
	thess = (double*)malloc(sizeof(double)* pq*pq);
	dx = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);

	obj->N = N;

	offset = obj->offset;
	for (i = 0; i < p; ++i) {
		b[i] = phi[i];
	}
	for (i = 0; i < q; ++i) {
		b[p + i] = -theta[i];
	}
	for (i = 0; i < P; ++i) {
		b[p + q + i] = PHI[i];
	}
	for (i = 0; i < Q; ++i) {
		b[p + q + P + i] = -THETA[i];
	}

	if (obj->M == 1) {
		b[p + q + P + Q] = coeff;
	}

	obj->mean = coeff;

	//mdisplay(b, 1, p + q + P + Q);

	for (i = 0; i < N; ++i) {
		obj->x[offset + i] = obj->x[offset + 2 * N + i] = x[i];
	}
	for (i = N; i < 2 * N; ++i) {
		obj->x[offset + i] = 0.0;
	}
	//printf("\n %d %g ", pq,maxstep);

	custom_function as154_min = { fas154_seas, obj };
	retval = fminunc(&as154_min, NULL, pq, b, maxstep, optmethod, tf);
	if (retval == 0) {
		ret = 0;
	}
	else if (retval == 15) {
		ret = 15;
	}
	else if (retval == 4) {
		ret = 4;
	}
	else {
		ret = 1;
	}

	for (i = 0; i < pq; ++i) {
		dx[i] = 1.0;
	}

	//Check for invertibility

	if (q > 0) {
		invertroot(q,tf+p);
	}

	if (Q > 0) {
		invertroot(Q,tf+p+q+P);
	}

	//if (obj->M == 1) dx[pq - 1] = sigma;

	hessian_fd(&as154_min, tf, pq, dx, obj->eps, hess);

	mtranspose(hess, pq, pq, thess);

	for (i = 0; i < pq*pq; ++i) {
		thess[i] = (length - d - s*D) * 0.5 * (hess[i] + thess[i]);
	}

	//mdisplay(thess,pq,pq);

	ludecomp(thess, pq, ipiv);
	minverse(thess, pq, ipiv, hess);

	//mdisplay(hess,pq,pq);


	for (i = 0; i < p; ++i) {
		phi[i] = tf[i];
	}
	for (i = 0; i < q; ++i) {
		theta[i] = -tf[p + i];
	}
	for (i = 0; i < P; ++i) {
		PHI[i] = tf[p + q + i];
	}
	for (i = 0; i < Q; ++i) {
		THETA[i] = -tf[p + q + P + i];
	}

	if (obj->M == 1) {
		*wmean = tf[p + q + Q + P];
	}
	else {
		*wmean = 0.0;
	}

	*var = (obj->ssq) / (double) N;
	*loglik = obj->loglik;
	//printf("MEAN %g \n", mean(obj->x+N,N));
	//mdisplay(obj->x + N, 1, N);

	free(b);
	free(tf);
	free(inp2);
	free(x);
	free(dx);
	free(thess);
	free(ipiv);
	free_alik_seas(obj);
	return ret;
}